

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyall.cpp
# Opt level: O3

int copyall_main(int argc,char **argv)

{
  Env **ppEVar1;
  FILE *__stream;
  Status SVar2;
  _Alloc_hider _Var3;
  char cVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined1 auVar8 [16];
  Status status;
  string copy_path;
  string path;
  Slice key;
  Slice value;
  DecompressAllocator decompress_allocator;
  Status local_12d8;
  long *local_12d0;
  long local_12c8;
  long local_12c0;
  long lStack_12b8;
  long *local_12b0;
  long local_12a8;
  long local_12a0;
  long lStack_1298;
  string local_1290;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  string local_1250;
  undefined **local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1200;
  undefined2 local_11e8;
  undefined8 local_11e0;
  undefined ***local_11d8;
  DB local_11d0;
  DB local_900;
  
  if ((argc < 4) || (iVar5 = strcmp("help",argv[1]), iVar5 == 0)) {
    printf("Usage: %s copyall <source_minecraft_world_dir> <dest_minecraft_world_dir>\n",*argv);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d0,argv[2],(allocator<char> *)&local_900);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_11d0);
  local_12b0 = &local_12a0;
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_12a0 = *plVar7;
    lStack_1298 = plVar6[3];
  }
  else {
    local_12a0 = *plVar7;
    local_12b0 = (long *)*plVar6;
  }
  local_12a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  ppEVar1 = &local_11d0.options_.env;
  if (local_11d0.options_.comparator != (Comparator *)ppEVar1) {
    operator_delete(local_11d0.options_.comparator,
                    (ulong)((long)&(local_11d0.options_.env)->_vptr_Env + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d0,argv[3],(allocator<char> *)&local_900);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_11d0);
  local_12d0 = &local_12c0;
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_12c0 = *plVar7;
    lStack_12b8 = plVar6[3];
  }
  else {
    local_12c0 = *plVar7;
    local_12d0 = (long *)*plVar6;
  }
  local_12c8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_11d0.options_.comparator != (Comparator *)ppEVar1) {
    operator_delete(local_11d0.options_.comparator,
                    (ulong)((long)&(local_11d0.options_.env)->_vptr_Env + 1));
  }
  mcberepair::DB::DB(&local_11d0,(char *)local_12b0,false,false);
  if ((_Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>)
      local_11d0.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t
      .super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl == (DB *)0x0) {
    copyall_main();
    iVar5 = 1;
  }
  else {
    mcberepair::DB::DB(&local_900,(char *)local_12d0,true,true);
    if (local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
        _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0) {
      copyall_main();
      iVar5 = 1;
    }
    else {
      local_11e0 = 0;
      local_11d8 = &local_1230;
      local_1230 = &PTR__DecompressAllocator_00131540;
      local_1228 = 0;
      uStack_1220 = 0;
      local_1218 = 0;
      uStack_1210 = 0;
      local_1208 = 0;
      vStack_1200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_1200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_1200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_11e8 = 1;
      iVar5 = (*(*(_func_int ***)
                  local_11d0.db_._M_t.
                  super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
                  super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
                  super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[6])();
      plVar6 = (long *)CONCAT44(extraout_var,iVar5);
      local_12d8.state_ = (char *)0x0;
      (**(code **)(*plVar6 + 0x18))(plVar6);
      while( true ) {
        cVar4 = (**(code **)(*plVar6 + 0x10))(plVar6);
        if (cVar4 == '\0') break;
        auVar8 = (**(code **)(*plVar6 + 0x40))(plVar6);
        local_1270 = auVar8;
        auVar8 = (**(code **)(*plVar6 + 0x48))(plVar6);
        local_1250._M_dataplus._M_p._0_1_ = 0;
        local_1260 = auVar8;
        (*(*(_func_int ***)
            local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>
            ._M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
            super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[2])
                  (&local_1290,
                   local_900.db_._M_t.
                   super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
                   super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
                   super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl,&local_1250,local_1270,
                   local_1260);
        SVar2.state_ = local_12d8.state_;
        local_12d8.state_ = local_1290._M_dataplus._M_p;
        local_1290._M_dataplus._M_p = SVar2.state_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)SVar2.state_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(SVar2.state_);
        }
        __stream = _stderr;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12d8.state_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_1290._M_dataplus._M_p = (pointer)&local_1290.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1290,local_1270._0_8_,local_1270._8_8_ + local_1270._0_8_);
          _Var3._M_p = local_1290._M_dataplus._M_p;
          leveldb::Status::ToString_abi_cxx11_(&local_1250,&local_12d8);
          fprintf(__stream,"ERROR: copying key \'%s\' failed: %s\n",_Var3._M_p,
                  CONCAT71(local_1250._M_dataplus._M_p._1_7_,local_1250._M_dataplus._M_p._0_1_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1250._M_dataplus._M_p._1_7_,local_1250._M_dataplus._M_p._0_1_) !=
              &local_1250.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1250._M_dataplus._M_p._1_7_,
                                     local_1250._M_dataplus._M_p._0_1_),
                            local_1250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
            operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1
                           );
          }
          goto LAB_0010959f;
        }
        (**(code **)(*plVar6 + 0x30))(plVar6);
      }
      iVar5 = 0;
      (*(*(_func_int ***)
          local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
          _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
          super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[0xb])
                (local_900.db_._M_t.
                 super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
                 super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
                 super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl,0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12d8.state_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        leveldb::Status::ToString_abi_cxx11_(&local_1290,&local_12d8);
        copyall_main();
LAB_0010959f:
        iVar5 = 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12d8.state_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(local_12d8.state_);
        }
      }
      (**(code **)(*plVar6 + 8))(plVar6);
      local_1230 = &PTR__DecompressAllocator_00131540;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_1200);
    }
    if (local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
        _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0) {
      (*(*(_func_int ***)
          local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
          _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
          super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[1])();
    }
    local_900.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
    super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
    super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl =
         (__uniq_ptr_data<leveldb::DB,_std::default_delete<leveldb::DB>,_true,_true>)
         (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0;
    leveldb::Logger::~Logger(&local_900.info_log.super_Logger);
    if ((_Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>)
        local_900.block_cache_._M_t.
        super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
        super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
        super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl != (Cache *)0x0) {
      (**(code **)(*(long *)local_900.block_cache_._M_t.
                            super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>
                            .super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl + 8))();
    }
    local_900.block_cache_._M_t.
    super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
    super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
    super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl =
         (__uniq_ptr_data<leveldb::Cache,_std::default_delete<leveldb::Cache>,_true,_true>)
         (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0;
    if ((_Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>)
        local_900.filter_policy_._M_t.
        super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
        .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl !=
        (_Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_900.filter_policy_._M_t.
          super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
          ._M_t.
          super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
          .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl)[1])();
    }
  }
  if (local_11d0.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t
      .super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0) {
    (*(*(_func_int ***)
        local_11d0.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
        _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[1])();
  }
  local_11d0.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
  super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
  super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl =
       (__uniq_ptr_data<leveldb::DB,_std::default_delete<leveldb::DB>,_true,_true>)
       (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0;
  leveldb::Logger::~Logger(&local_11d0.info_log.super_Logger);
  if ((__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)
      local_11d0.block_cache_._M_t.
      super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
      super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0) {
    (**(code **)(*(long *)local_11d0.block_cache_._M_t.
                          super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>
                          .super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl + 8))();
  }
  local_11d0.block_cache_._M_t.
  super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
  super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
  super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl =
       (__uniq_ptr_data<leveldb::Cache,_std::default_delete<leveldb::Cache>,_true,_true>)
       (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0;
  if ((tuple<const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>)
      local_11d0.filter_policy_._M_t.
      super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
      .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl !=
      (_Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_11d0.filter_policy_._M_t.
        super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
        .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl)[1])();
  }
  if (local_12d0 != &local_12c0) {
    operator_delete(local_12d0,local_12c0 + 1);
  }
  if (local_12b0 == &local_12a0) {
    return iVar5;
  }
  operator_delete(local_12b0,local_12a0 + 1);
  return iVar5;
}

Assistant:

int copyall_main(int argc, char *argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf(
            "Usage: %s copyall <source_minecraft_world_dir> "
            "<dest_minecraft_world_dir>\n",
            argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";
    std::string copy_path = std::string(argv[3]) + "/db";

    // open the input database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    // open the destination database
    mcberepair::DB copy_db{copy_path.c_str(), true, true};

    if(!copy_db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", copy_path.c_str());
        return EXIT_FAILURE;
    }

    // create a reusable memory space for decompression so it allocates less
    leveldb::ReadOptions readOptions;
    leveldb::DecompressAllocator decompress_allocator;
    readOptions.decompress_allocator = &decompress_allocator;
    readOptions.verify_checksums = true;
    readOptions.fill_cache = false;

    // create an iterator for the database
    auto it = std::unique_ptr<leveldb::Iterator>{db().NewIterator(readOptions)};

    leveldb::Status status;

    for(it->SeekToFirst(); it->Valid(); it->Next()) {
        auto key = it->key();
        auto value = it->value();
        status = copy_db().Put({}, key, value);
        if(!status.ok()) {
            // LCOV_EXCL_START
            fprintf(stderr, "ERROR: copying key '%s' failed: %s\n",
                    key.ToString().c_str(), status.ToString().c_str());
            return EXIT_FAILURE;
            // LCOV_EXCL_STOP
        }
    }
    copy_db().CompactRange(nullptr, nullptr);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: copying '%s' to '%s' failed: %s\n",
                path.c_str(), copy_path.c_str(), status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }
    return EXIT_SUCCESS;
}